

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O2

void seekcol(FILE *f,int src,int dst)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = dst - src;
  if (uVar2 == 0 || dst < src) {
    fputc(9,(FILE *)f);
    return;
  }
  iVar1 = src / -8 + dst / 8;
  if (iVar1 != 0) {
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      fputc(9,(FILE *)f);
    }
    uVar2 = dst & 7;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    fputc(0x20,(FILE *)f);
  }
  return;
}

Assistant:

void seekcol (FILE *f, int src, int dst) {
	if (dst <= src)
		fprintf (f, "\t");
	else {
		int n = dst/8 - src/8;
		if (n) {
			while (n--)
				fprintf (f, "\t");
			n = dst&7;
		} else
			n = dst-src;
		while (n--)
			fprintf (f, " ");
	}
}